

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall EnvelopeGenerator::setActualSustainLevel(EnvelopeGenerator *this,int sl)

{
  double dVar1;
  
  if (sl == 0xf) {
    dVar1 = -93.0;
  }
  else {
    dVar1 = (double)(sl * -3);
  }
  this->sustainLevel = dVar1;
  return;
}

Assistant:

void EnvelopeGenerator::setActualSustainLevel(int sl) {
	// If all SL bits are 1, sustain level is set to -93 dB:
   if(sl == 0x0F) {
	   sustainLevel = -93;
	   return;
   } 
   // The datasheet states that the SL formula is
   // sustainLevel = -24*d7 -12*d6 -6*d5 -3*d4,
   // translated as:
   sustainLevel = -3*sl;
}